

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.h
# Opt level: O2

void __thiscall
slang::ast::RangeSelectExpression::visitExprs<slang::ast::CheckerMemberVisitor&>
          (RangeSelectExpression *this,CheckerMemberVisitor *visitor)

{
  Expression::visit<slang::ast::CheckerMemberVisitor&>(this->value_,visitor);
  Expression::visit<slang::ast::CheckerMemberVisitor&>(this->left_,visitor);
  Expression::visit<slang::ast::CheckerMemberVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        value().visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }